

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O0

void __thiscall
OpenMesh::PolyConnectivity::adjust_outgoing_halfedge(PolyConnectivity *this,VertexHandle _vh)

{
  bool bVar1;
  value_type vVar2;
  undefined1 local_30 [8];
  ConstVertexOHalfedgeIter vh_it;
  PolyConnectivity *this_local;
  VertexHandle _vh_local;
  
  vh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._16_8_ = this;
  cvoh_iter((ConstVertexOHalfedgeIter *)local_30,this,_vh);
  while( true ) {
    bVar1 = Iterators::
            GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
            ::is_valid((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                        *)local_30);
    if (!bVar1) {
      return;
    }
    vVar2 = Iterators::
            GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
            ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                         *)local_30);
    bVar1 = is_boundary(this,(HalfedgeHandle)vVar2.super_BaseHandle.idx_);
    if (bVar1) break;
    Iterators::
    GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
    ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                  *)local_30);
  }
  vVar2 = Iterators::
          GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
          ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                       *)local_30);
  ArrayKernel::set_halfedge_handle
            (&this->super_ArrayKernel,_vh,(HalfedgeHandle)vVar2.super_BaseHandle.idx_);
  return;
}

Assistant:

void PolyConnectivity::adjust_outgoing_halfedge(VertexHandle _vh)
{
  for (ConstVertexOHalfedgeIter vh_it=cvoh_iter(_vh); vh_it.is_valid(); ++vh_it)
  {
    if (is_boundary(*vh_it))
    {
      set_halfedge_handle(_vh, *vh_it);
      break;
    }
  }
}